

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

void xmlParseConditionalSections(xmlParserCtxtPtr ctxt)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long local_48;
  size_t ignoreDepth;
  int newSize;
  int *tmp;
  ulong uStack_28;
  int id;
  size_t depth;
  size_t inputIdsSize;
  int *inputIds;
  xmlParserCtxtPtr ctxt_local;
  
  inputIdsSize = 0;
  depth = 0;
  uStack_28 = 0;
  do {
    if (1 < ctxt->disableSAX) {
LAB_00144931:
      (*xmlFree)((void *)inputIdsSize);
      return;
    }
    if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) && (ctxt->input->cur[2] == '[')
       ) {
      iVar1 = ctxt->input->id;
      ctxt->input->cur = ctxt->input->cur + 3;
      ctxt->input->col = ctxt->input->col + 3;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
      xmlSkipBlankCharsPE(ctxt);
      if (((((*ctxt->input->cur == 'I') && (ctxt->input->cur[1] == 'N')) &&
           (ctxt->input->cur[2] == 'C')) &&
          ((ctxt->input->cur[3] == 'L' && (ctxt->input->cur[4] == 'U')))) &&
         ((ctxt->input->cur[5] == 'D' && (ctxt->input->cur[6] == 'E')))) {
        ctxt->input->cur = ctxt->input->cur + 7;
        ctxt->input->col = ctxt->input->col + 7;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
        xmlSkipBlankCharsPE(ctxt);
        if (*ctxt->input->cur != '[') {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_00144931;
        }
        if (ctxt->input->id != iVar1) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        xmlNextChar(ctxt);
        if (depth <= uStack_28) {
          iVar2 = xmlGrowCapacity((int)depth,4,4,1000);
          if (iVar2 < 0) {
            xmlFatalErrMsg(ctxt,XML_ERR_RESOURCE_LIMIT,
                           "Maximum conditional section nesting depth exceeded\n");
            goto LAB_00144931;
          }
          pvVar3 = (*xmlRealloc)((void *)inputIdsSize,(long)iVar2 << 2);
          if (pvVar3 == (void *)0x0) {
            xmlErrMemory(ctxt);
            goto LAB_00144931;
          }
          depth = (size_t)iVar2;
          inputIdsSize = (size_t)pvVar3;
        }
        *(int *)(inputIdsSize + uStack_28 * 4) = iVar1;
        uStack_28 = uStack_28 + 1;
      }
      else {
        if ((((*ctxt->input->cur != 'I') || (ctxt->input->cur[1] != 'G')) ||
            (ctxt->input->cur[2] != 'N')) ||
           (((ctxt->input->cur[3] != 'O' || (ctxt->input->cur[4] != 'R')) ||
            (ctxt->input->cur[5] != 'E')))) {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID_KEYWORD,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_00144931;
        }
        local_48 = 0;
        ctxt->input->cur = ctxt->input->cur + 6;
        ctxt->input->col = ctxt->input->col + 6;
        if (*ctxt->input->cur == '\0') {
          xmlParserGrow(ctxt);
        }
        xmlSkipBlankCharsPE(ctxt);
        if (*ctxt->input->cur != '[') {
          xmlFatalErr(ctxt,XML_ERR_CONDSEC_INVALID,(char *)0x0);
          xmlHaltParser(ctxt);
          goto LAB_00144931;
        }
        if (ctxt->input->id != iVar1) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
        xmlNextChar(ctxt);
        while (ctxt->disableSAX < 2) {
          if (*ctxt->input->cur == '\0') {
            xmlFatalErr(ctxt,XML_ERR_CONDSEC_NOT_FINISHED,(char *)0x0);
            goto LAB_00144931;
          }
          if (((*ctxt->input->cur == '<') && (ctxt->input->cur[1] == '!')) &&
             (ctxt->input->cur[2] == '[')) {
            ctxt->input->cur = ctxt->input->cur + 3;
            ctxt->input->col = ctxt->input->col + 3;
            if (*ctxt->input->cur == '\0') {
              xmlParserGrow(ctxt);
            }
            local_48 = local_48 + 1;
            if (local_48 == 0) {
              xmlErrMemory(ctxt);
              goto LAB_00144931;
            }
          }
          else if (((*ctxt->input->cur == ']') && (ctxt->input->cur[1] == ']')) &&
                  (ctxt->input->cur[2] == '>')) {
            ctxt->input->cur = ctxt->input->cur + 3;
            ctxt->input->col = ctxt->input->col + 3;
            if (*ctxt->input->cur == '\0') {
              xmlParserGrow(ctxt);
            }
            if (local_48 == 0) break;
            local_48 = local_48 + -1;
          }
          else {
            xmlNextChar(ctxt);
          }
        }
        if (ctxt->input->id != iVar1) {
          xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                         "All markup of the conditional section is not in the same entity\n");
        }
      }
    }
    else if (((uStack_28 == 0) || (*ctxt->input->cur != ']')) ||
            ((ctxt->input->cur[1] != ']' || (ctxt->input->cur[2] != '>')))) {
      if ((*ctxt->input->cur != '<') ||
         ((ctxt->input->cur[1] != '!' && (ctxt->input->cur[1] != '?')))) {
        xmlFatalErr(ctxt,XML_ERR_EXT_SUBSET_NOT_FINISHED,(char *)0x0);
        xmlHaltParser(ctxt);
        goto LAB_00144931;
      }
      xmlParseMarkupDecl(ctxt);
    }
    else {
      uStack_28 = uStack_28 - 1;
      if (ctxt->input->id != *(int *)(inputIdsSize + uStack_28 * 4)) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "All markup of the conditional section is not in the same entity\n");
      }
      ctxt->input->cur = ctxt->input->cur + 3;
      ctxt->input->col = ctxt->input->col + 3;
      if (*ctxt->input->cur == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    if (uStack_28 == 0) goto LAB_00144931;
    xmlSkipBlankCharsPE(ctxt);
    if ((ctxt->input->flags & 0x40U) == 0) {
      xmlParserShrink(ctxt);
    }
    if (((ctxt->input->flags & 0x40U) == 0) &&
       ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
  } while( true );
}

Assistant:

static void
xmlParseConditionalSections(xmlParserCtxtPtr ctxt) {
    int *inputIds = NULL;
    size_t inputIdsSize = 0;
    size_t depth = 0;

    while (PARSER_STOPPED(ctxt) == 0) {
        if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
            int id = ctxt->input->id;

            SKIP(3);
            SKIP_BLANKS_PE;

            if (CMP7(CUR_PTR, 'I', 'N', 'C', 'L', 'U', 'D', 'E')) {
                SKIP(7);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                if (inputIdsSize <= depth) {
                    int *tmp;
                    int newSize;

                    newSize = xmlGrowCapacity(inputIdsSize, sizeof(tmp[0]),
                                              4, 1000);
                    if (newSize < 0) {
                        xmlFatalErrMsg(ctxt, XML_ERR_RESOURCE_LIMIT,
                                       "Maximum conditional section nesting"
                                       " depth exceeded\n");
                        goto error;
                    }
                    tmp = xmlRealloc(inputIds, newSize * sizeof(tmp[0]));
                    if (tmp == NULL) {
                        xmlErrMemory(ctxt);
                        goto error;
                    }
                    inputIds = tmp;
                    inputIdsSize = newSize;
                }
                inputIds[depth] = id;
                depth++;
            } else if (CMP6(CUR_PTR, 'I', 'G', 'N', 'O', 'R', 'E')) {
                size_t ignoreDepth = 0;

                SKIP(6);
                SKIP_BLANKS_PE;
                if (RAW != '[') {
                    xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID, NULL);
                    xmlHaltParser(ctxt);
                    goto error;
                }
                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
                NEXT;

                while (PARSER_STOPPED(ctxt) == 0) {
                    if (RAW == 0) {
                        xmlFatalErr(ctxt, XML_ERR_CONDSEC_NOT_FINISHED, NULL);
                        goto error;
                    }
                    if ((RAW == '<') && (NXT(1) == '!') && (NXT(2) == '[')) {
                        SKIP(3);
                        ignoreDepth++;
                        /* Check for integer overflow */
                        if (ignoreDepth == 0) {
                            xmlErrMemory(ctxt);
                            goto error;
                        }
                    } else if ((RAW == ']') && (NXT(1) == ']') &&
                               (NXT(2) == '>')) {
                        SKIP(3);
                        if (ignoreDepth == 0)
                            break;
                        ignoreDepth--;
                    } else {
                        NEXT;
                    }
                }

                if (ctxt->input->id != id) {
                    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                                   "All markup of the conditional section is"
                                   " not in the same entity\n");
                }
            } else {
                xmlFatalErr(ctxt, XML_ERR_CONDSEC_INVALID_KEYWORD, NULL);
                xmlHaltParser(ctxt);
                goto error;
            }
        } else if ((depth > 0) &&
                   (RAW == ']') && (NXT(1) == ']') && (NXT(2) == '>')) {
            depth--;
            if (ctxt->input->id != inputIds[depth]) {
                xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
                               "All markup of the conditional section is not"
                               " in the same entity\n");
            }
            SKIP(3);
        } else if ((RAW == '<') && ((NXT(1) == '!') || (NXT(1) == '?'))) {
            xmlParseMarkupDecl(ctxt);
        } else {
            xmlFatalErr(ctxt, XML_ERR_EXT_SUBSET_NOT_FINISHED, NULL);
            xmlHaltParser(ctxt);
            goto error;
        }

        if (depth == 0)
            break;

        SKIP_BLANKS_PE;
        SHRINK;
        GROW;
    }

error:
    xmlFree(inputIds);
}